

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O3

CURLcode Curl_cf_h2_proxy_insert_after(Curl_cfilter *cf,Curl_easy *data)

{
  CURLcode CVar1;
  cf_h2_proxy_ctx *ctx;
  Curl_cfilter *cf_h2_proxy;
  Curl_cfilter *local_20;
  
  local_20 = (Curl_cfilter *)0x0;
  ctx = (cf_h2_proxy_ctx *)(*Curl_ccalloc)(1,0x148);
  if (ctx == (cf_h2_proxy_ctx *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar1 = Curl_cf_create(&local_20,&Curl_cft_h2_proxy,ctx);
    if (CVar1 == CURLE_OK) {
      Curl_conn_cf_insert_after(cf,local_20);
      CVar1 = CURLE_OK;
    }
    else {
      cf_h2_proxy_ctx_clear(ctx);
      (*Curl_cfree)(ctx);
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cf_h2_proxy_insert_after(struct Curl_cfilter *cf,
                                       struct Curl_easy *data)
{
  struct Curl_cfilter *cf_h2_proxy = NULL;
  struct cf_h2_proxy_ctx *ctx;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  (void)data;
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx)
    goto out;

  result = Curl_cf_create(&cf_h2_proxy, &Curl_cft_h2_proxy, ctx);
  if(result)
    goto out;

  Curl_conn_cf_insert_after(cf, cf_h2_proxy);
  result = CURLE_OK;

out:
  if(result)
    cf_h2_proxy_ctx_free(ctx);
  return result;
}